

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storefst.h
# Opt level: O0

void __thiscall
PDA::Transducer::Grammar::Rule::Rule<wchar_t[2]>(Rule *this,wchar_t leftSide,wchar_t (*first) [2])

{
  wchar_t (*first_local) [2];
  wchar_t leftSide_local;
  Rule *this_local;
  
  std::vector<PDA::Transducer::Grammar::Chain,_std::allocator<PDA::Transducer::Grammar::Chain>_>::
  vector(&this->m_chains);
  std::__cxx11::wstring::wstring((wstring *)&this->m_errorString);
  this->m_left = leftSide;
  addChains<wchar_t[2]>(this,first);
  return;
}

Assistant:

Rule(const wchar_t leftSide, const First &first, const Rest&... rest)
        {
            m_left = leftSide;
            addChains(first, rest...);
        }